

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addressmap-inl.h
# Opt level: O0

void __thiscall
AddressMap<int>::Iterate(AddressMap<int> *this,FunctionRef<void_(const_void_*,_int_*)> body)

{
  Entry *local_40;
  Entry *e;
  Cluster *pCStack_30;
  int b;
  Cluster *c;
  int h;
  AddressMap<int> *this_local;
  FunctionRef<void_(const_void_*,_int_*)> body_local;
  
  body_local.fn = (_func_void_void_ptr_int_ptr_void_ptr *)body.data;
  this_local = (AddressMap<int> *)body.fn;
  for (c._4_4_ = 0; c._4_4_ < 0x1000; c._4_4_ = c._4_4_ + 1) {
    for (pCStack_30 = this->hashtable_[c._4_4_]; pCStack_30 != (Cluster *)0x0;
        pCStack_30 = pCStack_30->next) {
      for (e._4_4_ = 0; e._4_4_ < 0x2000; e._4_4_ = e._4_4_ + 1) {
        for (local_40 = pCStack_30->blocks[e._4_4_]; local_40 != (Entry *)0x0;
            local_40 = local_40->next) {
          tcmalloc::FunctionRef<void_(const_void_*,_int_*)>::operator()
                    ((FunctionRef<void_(const_void_*,_int_*)> *)&this_local,local_40->key,
                     &local_40->value);
        }
      }
    }
  }
  return;
}

Assistant:

void AddressMap<Value>::Iterate(tcmalloc::FunctionRef<void(Key, Value*)> body) const {
  // We could optimize this by traversing only non-empty clusters and/or blocks
  // but it does not speed up heap-checker noticeably.
  for (int h = 0; h < kHashSize; ++h) {
    for (const Cluster* c = hashtable_[h]; c != nullptr; c = c->next) {
      for (int b = 0; b < kClusterBlocks; ++b) {
        for (Entry* e = c->blocks[b]; e != nullptr; e = e->next) {
          body(e->key, &e->value);
        }
      }
    }
  }
}